

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O0

Type * QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>::
       instance(void)

{
  int iVar1;
  PlainType *pPVar2;
  ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader> *in_stack_00000018;
  
  if (QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>>::
      instance()::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      __cxa_atexit(QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::
                   ~ApplicationHolder,
                   &QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>>
                    ::instance()::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>>
                           ::instance()::holder);
    }
  }
  pPVar2 = QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>::pointer
                     (in_stack_00000018);
  return pPVar2;
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }